

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_filter.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConjunctionAndFilter::ToExpression(ConjunctionAndFilter *this,Expression *column)

{
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *puVar1;
  BoundConjunctionExpression *this_00;
  pointer pBVar2;
  pointer pTVar3;
  pointer *__ptr;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *this_01;
  _Head_base<0UL,_duckdb::BoundConjunctionExpression_*,_false> local_48;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_38;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
       (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)this;
  this_00 = (BoundConjunctionExpression *)operator_new(0x70);
  BoundConjunctionExpression::BoundConjunctionExpression(this_00,CONJUNCTION_AND);
  this_01 = (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
            (column->super_BaseExpression).alias._M_dataplus._M_p;
  puVar1 = (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
           (column->super_BaseExpression).alias._M_string_length;
  local_48._M_head_impl = this_00;
  if (this_01 != puVar1) {
    do {
      pBVar2 = unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundConjunctionExpression,_std::default_delete<duckdb::BoundConjunctionExpression>,_true>
                             *)&local_48);
      pTVar3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
               operator->(this_01);
      (*pTVar3->_vptr_TableFilter[6])(&local_40,pTVar3);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar2->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_40);
      if (local_40._M_head_impl != (Expression *)0x0) {
        (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  *(BoundConjunctionExpression **)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
   super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = local_48._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_38._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Expression> ConjunctionAndFilter::ToExpression(const Expression &column) const {
	auto conjunction = make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND);
	for (auto &filter : child_filters) {
		conjunction->children.push_back(filter->ToExpression(column));
	}
	return std::move(conjunction);
}